

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int level;
  Argument *pAVar2;
  enable_if_t<std::is_arithmetic_v<int>,_Argument_&> this;
  ostream *poVar3;
  runtime_error *e_1;
  lmss l;
  string local_368;
  logger local_344;
  undefined1 auStack_340 [4];
  logger log;
  undefined1 auStack_328 [4];
  int log_level;
  exception *e;
  string local_308;
  bool local_2e1;
  any local_2e0;
  bool local_2ca;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  int local_280 [9];
  allocator<char> local_259;
  string local_258;
  allocator<char> local_221;
  string local_220;
  undefined1 local_200 [8];
  ArgumentParser app;
  char **argv_local;
  int argc_local;
  
  app._480_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"lmss",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"4.2.3",&local_259);
  argparse::ArgumentParser::ArgumentParser
            ((ArgumentParser *)local_200,&local_220,&local_258,help,true,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*>((ArgumentParser *)local_200,"-v");
  local_280[8] = 3;
  pAVar2 = argparse::Argument::default_value<int>(pAVar2,local_280 + 8);
  local_280[7] = 0;
  local_280[6] = 1;
  local_280[5] = 2;
  local_280[4] = 3;
  local_280[3] = 4;
  local_280[2] = 5;
  local_280[1] = 6;
  local_280[0] = 7;
  pAVar2 = argparse::Argument::choices<int,int,int,int,int,int,int,int>
                     (pAVar2,local_280 + 7,local_280 + 6,local_280 + 5,local_280 + 4,local_280 + 3,
                      local_280 + 2,local_280 + 1,local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"LEVEL",&local_2a1);
  pAVar2 = argparse::Argument::metavar(pAVar2,&local_2a0);
  pAVar2 = argparse::Argument::nargs(pAVar2,1);
  this = argparse::Argument::scan<(char)105,int>(pAVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"set log verbosity (0-7)",&local_2c9);
  argparse::Argument::help(this,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  pAVar2 = argparse::ArgumentParser::add_argument<char_const*,char_const*>
                     ((ArgumentParser *)local_200,"-V","--version");
  local_2ca = false;
  pAVar2 = argparse::Argument::default_value<bool>(pAVar2,&local_2ca);
  local_2e1 = true;
  std::any::any<bool,bool,std::any::_Manager_internal<bool>,void>(&local_2e0,&local_2e1);
  pAVar2 = argparse::Argument::implicit_value(pAVar2,&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"print lmss version",(allocator<char> *)((long)&e + 7));
  argparse::Argument::help(pAVar2,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::any::~any(&local_2e0);
  argparse::ArgumentParser::parse_args((ArgumentParser *)local_200,argc,(char **)app._480_8_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_328,"-V");
  bVar1 = argparse::ArgumentParser::get<bool>((ArgumentParser *)local_200,_auStack_328);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_340,"-v");
    level = argparse::ArgumentParser::get<int>((ArgumentParser *)local_200,_auStack_340);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"LMSS",(allocator<char> *)&l.field_0x117);
    logger::logger(&local_344,&local_368,level);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator((allocator<char> *)&l.field_0x117);
    do {
      lmss::lmss((lmss *)&e_1,&local_344);
      lmss::run((lmss *)&e_1);
      lmss::~lmss((lmss *)&e_1);
    } while( true );
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"lmss version ");
  poVar3 = std::operator<<(poVar3,"4.2.3");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  argparse::ArgumentParser::~ArgumentParser((ArgumentParser *)local_200);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    argparse::ArgumentParser app("lmss", VERSION, argparse::default_arguments::help);
    app.add_argument("-v")
        .default_value(3)
        .choices(0, 1, 2, 3, 4, 5, 6, 7)
        .metavar("LEVEL")
        .nargs(1)
        .scan<'i', int>()
        .help("set log verbosity (0-7)");
    app.add_argument("-V", "--version")
        .default_value(false)
        .implicit_value(true)
        .help("print lmss version");

    try {
        app.parse_args(argc, argv);
    } catch (std::exception const & e) {
        std::cerr << e.what() << std::endl;
        std::cerr << app;
        std::exit(1);
    }

    if (app.get<bool>("-V")) {
        std::cout << "lmss version " << VERSION << std::endl;
        return 0;
    }

    auto log_level = app.get<int>("-v");

    logger log("LMSS", log_level);

    while (true) {
        try {
            lmss l(log);
            l.run();
        } catch (std::runtime_error const & e) {
            log.err(e.what());
            log.warn("reinitializing");
            std::this_thread::sleep_for(std::chrono::seconds(1));
        }
    }

    return 0;
}